

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::LevelSpawned(AActor *this)

{
  byte *pbVar1;
  int iVar2;
  AActor *pAVar3;
  
  if ((0 < this->tics) && (((this->flags4).Value & 0x200000) == 0)) {
    iVar2 = FRandom::operator()(&pr_spawnmapthing);
    this->tics = iVar2 % this->tics + 1;
  }
  pAVar3 = GetDefault(this);
  if (((pAVar3->flags).Value & 0x20000) == 0) {
    pbVar1 = (byte *)((long)&(this->flags).Value + 2);
    *pbVar1 = *pbVar1 & 0xfd;
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[0xb])(this);
  return;
}

Assistant:

void AActor::LevelSpawned ()
{
	if (tics > 0 && !(flags4 & MF4_SYNCHRONIZED))
	{
		tics = 1 + (pr_spawnmapthing() % tics);
	}
	// [RH] Clear MF_DROPPED flag if the default version doesn't have it set.
	// (AInventory::BeginPlay() makes all inventory items spawn with it set.)
	if (!(GetDefault()->flags & MF_DROPPED))
	{
		flags &= ~MF_DROPPED;
	}
	HandleSpawnFlags ();
}